

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_convert.cpp
# Opt level: O2

void Potassco::fail(int ec,char *file,uint line,char *exp,char *fmt,...)

{
  char in_AL;
  char *pcVar1;
  size_t sVar2;
  size_t sVar3;
  logic_error *this;
  code *pcVar4;
  undefined *puVar5;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  StringBuilder str;
  va_list args;
  undefined1 local_4d8 [40];
  undefined8 local_4b0;
  undefined8 local_4a8;
  undefined8 local_498;
  undefined8 local_488;
  undefined8 local_478;
  undefined8 local_468;
  undefined8 local_458;
  undefined8 local_448;
  undefined8 local_438;
  char msg [1024];
  
  if (in_AL != '\0') {
    local_4a8 = in_XMM0_Qa;
    local_498 = in_XMM1_Qa;
    local_488 = in_XMM2_Qa;
    local_478 = in_XMM3_Qa;
    local_468 = in_XMM4_Qa;
    local_458 = in_XMM5_Qa;
    local_448 = in_XMM6_Qa;
    local_438 = in_XMM7_Qa;
  }
  local_4b0 = in_R9;
  if (ec == 0) {
    fail(0x16,
         "void Potassco::fail(int, const char *, unsigned int, const char *, const char *, ...)",
         0x1c4,"ec != 0","error code must not be 0",0);
  }
  str.field_0.str_ = (string *)msg;
  str.field_0.buf_.used = 0;
  msg[0] = '\0';
  str.field_0.buf_.size = 0x3ff;
  str.field_0.sbo_[0x3f] = -0x80;
  if (ec < 1 && ec != -1) {
    if (fmt != (char *)0x0) goto LAB_00118836;
    pcVar1 = "runtime";
    if (ec == -2) {
      pcVar1 = "logic";
    }
    StringBuilder::appendFormat(&str,"%s error: ",pcVar1);
LAB_0011881b:
    if (exp != (char *)0x0) {
      StringBuilder::appendFormat(&str,"check(\'%s\') failed",exp);
    }
  }
  else {
    if (line != 0 && file != (char *)0x0) {
      StringBuilder::appendFormat(&str,"%s@%u: ");
    }
    if (ec < 1) {
      pcVar1 = "assertion failure";
    }
    else {
      pcVar1 = strerror(ec);
    }
    StringBuilder::append(&str,pcVar1);
    StringBuilder::append(&str,": ");
    if (fmt == (char *)0x0) goto LAB_0011881b;
LAB_00118836:
    args[0].reg_save_area = local_4d8;
    args[0].overflow_arg_area = &stack0x00000008;
    args[0].gp_offset = 0x28;
    args[0].fp_offset = 0x30;
    sVar2 = StringBuilder::size(&str);
    sVar3 = StringBuilder::size(&str);
    ::vsnprintf(msg + sVar2,0x400 - sVar3,fmt,args);
  }
  if (ec == -3) {
    this = (logic_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error((runtime_error *)this,msg);
LAB_00118a60:
    pcVar4 = std::runtime_error::~runtime_error;
    puVar5 = &std::runtime_error::typeinfo;
  }
  else {
    if (ec == 0x4b) {
      this = (logic_error *)__cxa_allocate_exception(0x10);
      std::overflow_error::overflow_error((overflow_error *)this,msg);
      pcVar4 = std::overflow_error::~overflow_error;
      puVar5 = &std::overflow_error::typeinfo;
      goto LAB_00118a6e;
    }
    if (ec == -1) {
      this = (logic_error *)__cxa_allocate_exception(0x10);
      std::logic_error::logic_error(this,msg);
    }
    else {
      if (ec == 7) {
        this = (logic_error *)__cxa_allocate_exception(0x10);
        std::length_error::length_error((length_error *)this,msg);
        pcVar4 = std::length_error::~length_error;
        puVar5 = &std::length_error::typeinfo;
        goto LAB_00118a6e;
      }
      if (ec == 0xc) {
        this = (logic_error *)__cxa_allocate_exception(8);
        *(code **)this = __isoc99_sscanf;
        pcVar4 = std::bad_alloc::~bad_alloc;
        puVar5 = &std::bad_alloc::typeinfo;
        goto LAB_00118a6e;
      }
      if (ec == 0x16) {
        this = (logic_error *)__cxa_allocate_exception(0x10);
        std::invalid_argument::invalid_argument((invalid_argument *)this,msg);
        pcVar4 = std::invalid_argument::~invalid_argument;
        puVar5 = &std::invalid_argument::typeinfo;
        goto LAB_00118a6e;
      }
      if (ec == 0x21) {
        this = (logic_error *)__cxa_allocate_exception(0x10);
        std::domain_error::domain_error((domain_error *)this,msg);
        pcVar4 = std::domain_error::~domain_error;
        puVar5 = &std::domain_error::typeinfo;
        goto LAB_00118a6e;
      }
      if (ec == 0x22) {
        this = (logic_error *)__cxa_allocate_exception(0x10);
        std::out_of_range::out_of_range((out_of_range *)this,msg);
        pcVar4 = std::out_of_range::~out_of_range;
        puVar5 = &std::out_of_range::typeinfo;
        goto LAB_00118a6e;
      }
      if (ec != -2) {
        this = (logic_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error((runtime_error *)this,msg);
        goto LAB_00118a60;
      }
      this = (logic_error *)__cxa_allocate_exception(0x10);
      std::logic_error::logic_error(this,msg);
    }
    pcVar4 = std::logic_error::~logic_error;
    puVar5 = &std::logic_error::typeinfo;
  }
LAB_00118a6e:
  __cxa_throw(this,puVar5,pcVar4);
}

Assistant:

void fail(int ec, const char* file, unsigned line, const char* exp, const char* fmt, ...) {
	POTASSCO_CHECK(ec != 0, EINVAL, "error code must not be 0");
	char msg[1024];
	StringBuilder str(msg, sizeof(msg));
	if (ec > 0 || ec == error_assert) {
		if (file && line) { str.appendFormat("%s@%u: ", file, line); }
		str.append(ec > 0 ? strerror(ec) : "assertion failure");
		str.append(": ");
	}
	else if (!fmt) {
		str.appendFormat("%s error: ", ec == error_logic ? "logic" : "runtime");
	}
	if (fmt) {
		va_list args;
		va_start(args, fmt);
		char* pos = msg + str.size();
		size_t sz = sizeof(msg) - str.size();
		vsnprintf(pos, sz, fmt, args);
		va_end(args);
	}
	else if (exp) {
		str.appendFormat("check('%s') failed", exp);
	}
	switch (ec) {
		case error_logic  : throw std::logic_error(msg);
		case error_assert : throw std::logic_error(msg);
		case error_runtime: throw std::runtime_error(msg);
		case E2BIG        : throw std::length_error(msg);
		case ENOMEM       : throw std::bad_alloc();
		case EINVAL       : throw std::invalid_argument(msg);
		case EDOM         : throw std::domain_error(msg);
		case ERANGE       : throw std::out_of_range(msg);
#if defined(EOVERFLOW)
		case EOVERFLOW    : throw std::overflow_error(msg);
#endif
		default           : throw std::runtime_error(msg);
	}
}